

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O2

void __thiscall QHstsPolicy::QHstsPolicy(QHstsPolicy *this)

{
  QHstsPolicyPrivate *this_00;
  
  this_00 = (QHstsPolicyPrivate *)operator_new(0x20);
  QHstsPolicyPrivate::QHstsPolicyPrivate(this_00);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QHstsPolicy::QHstsPolicy() : d(new QHstsPolicyPrivate)
{
}